

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O2

Iterator * __thiscall leveldb::Block::NewIterator(Block *this,Comparator *comparator)

{
  uint32_t num_restarts;
  Iter *this_00;
  Iterator *pIVar1;
  Status SStack_48;
  Slice local_40;
  Slice local_30;
  
  if (this->size_ < 4) {
    local_30.data_ = "bad block contents";
    local_30.size_ = 0x12;
    local_40.data_ = "";
    local_40.size_ = 0;
    Status::Corruption(&SStack_48,&local_30,&local_40);
    this_00 = (Iter *)NewErrorIterator(&SStack_48);
    Status::~Status(&SStack_48);
  }
  else {
    num_restarts = NumRestarts(this);
    if (num_restarts == 0) {
      pIVar1 = NewEmptyIterator();
      return pIVar1;
    }
    this_00 = (Iter *)operator_new(0x80);
    Iter::Iter(this_00,comparator,this->data_,this->restart_offset_,num_restarts);
  }
  return &this_00->super_Iterator;
}

Assistant:

Iterator* Block::NewIterator(const Comparator* comparator) {
  if (size_ < sizeof(uint32_t)) {
    return NewErrorIterator(Status::Corruption("bad block contents"));
  }
  const uint32_t num_restarts = NumRestarts();
  if (num_restarts == 0) {
    return NewEmptyIterator();
  } else {
    return new Iter(comparator, data_, restart_offset_, num_restarts);
  }
}